

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

void __thiscall S2Builder::ChooseInitialSites(S2Builder *this,S2PointIndex<int> *site_index)

{
  pointer *ppVVar1;
  double dVar2;
  double dVar3;
  iterator __position;
  pointer pRVar4;
  int iVar5;
  long lVar6;
  S2Point *point;
  InputVertexKey *key;
  pointer ppVar7;
  pointer pRVar8;
  pointer pRVar9;
  bool bVar10;
  const_iterator cVar11;
  S2Point site;
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  results;
  S2Point local_490;
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  local_478;
  vector<Vector3<double>,std::allocator<Vector3<double>>> *local_460;
  S2PointIndex<int> *local_458;
  _func_int **local_450;
  pointer local_448;
  vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> local_440;
  PointData local_428;
  Target local_408;
  VType local_400;
  VType VStack_3f8;
  VType local_3f0;
  S2ClosestPointQueryOptions local_3e8;
  Options local_3c8;
  S2ClosestPointQueryBase<S2MinDistance,_int> local_3a8;
  
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_3e8,INFINITY);
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_3c8,0.0);
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_error_.length2_._0_5_ =
       local_3c8.max_distance_.super_S1ChordAngle.length2_._0_5_;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_error_.length2_._5_3_ =
       local_3c8.max_distance_.super_S1ChordAngle.length2_._5_3_;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.region_._0_5_ = 0;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.region_._5_3_ = 0;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_results_ = 0x7fffffff;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.use_brute_force_ = false;
  S2ClosestPointQueryOptions::set_conservative_max_distance
            (&local_3e8,(S1ChordAngle)(this->min_site_separation_ca_).length2_);
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_3c8,INFINITY);
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_428,0.0);
  local_3c8.max_error_.length2_._0_5_ =
       (undefined5)
       CONCAT44(local_428.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>._4_4_,
                local_428.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
                super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl);
  local_3c8.max_error_.length2_._5_3_ =
       local_428.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>._5_3_;
  local_3c8.region_._0_5_ = 0;
  local_3c8.region_._5_3_ = 0;
  local_3c8.max_results_ = 0x7fffffff;
  local_3c8.use_brute_force_ = false;
  S2ClosestPointQueryBase<S2MinDistance,_int>::S2ClosestPointQueryBase(&local_3a8);
  local_3c8.region_._0_5_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.region_._0_5_;
  local_3c8.region_._5_3_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.region_._5_3_;
  local_3c8.max_results_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_results_;
  local_3c8.use_brute_force_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.use_brute_force_;
  local_3c8.max_distance_.super_S1ChordAngle.length2_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_distance_.
       super_S1ChordAngle.length2_;
  local_3c8.max_error_.length2_._0_5_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_error_.length2_._0_5_;
  local_3c8.max_error_.length2_._5_3_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_error_.length2_._5_3_;
  local_458 = site_index;
  local_3a8.index_ = site_index;
  local_3a8.iter_.map_ = &site_index->map_;
  local_3a8.iter_.iter_.node =
       gtl::internal_btree::
       btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
       ::leftmost((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                   *)site_index);
  local_3a8.iter_.iter_.position = 0;
  cVar11 = gtl::internal_btree::
           btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
           ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                  *)local_3a8.iter_.map_);
  local_3a8.iter_.end_.node = cVar11.node;
  local_3a8.iter_.end_.position = cVar11.position;
  if (local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_478.
  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.
  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478.
  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SortInputVertices(&local_440,this);
  local_448 = local_440.
              super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_440.
      super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_440.
      super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_460 = (vector<Vector3<double>,std::allocator<Vector3<double>>> *)&this->sites_;
    local_450 = (_func_int **)&PTR__S2DistanceTarget_002bbca8;
    ppVar7 = local_440.
             super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      point = (this->input_vertices_).
              super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
              super__Vector_impl_data._M_start + ppVar7->second;
      SnapSite(&local_490,this,point);
      bVar10 = true;
      if (this->snapping_needed_ == false) {
        lVar6 = 0;
        do {
          dVar2 = *(double *)((long)local_490.c_ + lVar6);
          dVar3 = *(double *)((long)point->c_ + lVar6);
          if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) break;
          bVar10 = lVar6 != 0x10;
          lVar6 = lVar6 + 8;
        } while (bVar10);
        bVar10 = (bool)(-(dVar2 != dVar3) & 1);
      }
      this->snapping_needed_ = bVar10;
      local_3f0 = local_490.c_[2];
      local_400 = local_490.c_[0];
      VStack_3f8 = local_490.c_[1];
      local_408._vptr_S2DistanceTarget = local_450;
      S2ClosestPointQueryBase<S2MinDistance,_int>::FindClosestPoints
                (&local_3a8,&local_408,&local_3c8,&local_478);
      pRVar4 = local_478.
               super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_478.
          super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_478.
          super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001a9c72:
        local_428.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.super__Tuple_impl<1UL,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl =
             (_Head_base<1UL,_int,_false>)
             ((int)((ulong)((long)(this->sites_).
                                  super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->sites_).
                                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555);
        local_428.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
        super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[2] = local_490.c_[2];
        local_428.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
        super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[0] = local_490.c_[0];
        local_428.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
        super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[1] = local_490.c_[1];
        S2PointIndex<int>::Add(local_458,&local_428);
        __position._M_current =
             (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
          _M_realloc_insert<Vector3<double>const&>(local_460,__position,&local_490);
        }
        else {
          (__position._M_current)->c_[2] = local_490.c_[2];
          (__position._M_current)->c_[0] = local_490.c_[0];
          (__position._M_current)->c_[1] = local_490.c_[1];
          ppVVar1 = &(this->sites_).
                     super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppVVar1 = *ppVVar1 + 1;
        }
        local_3a8.iter_.map_ = &(local_3a8.index_)->map_;
        local_3a8.iter_.iter_.node =
             gtl::internal_btree::
             btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
             ::leftmost((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                         *)local_3a8.index_);
        local_3a8.iter_.iter_.position = 0;
        cVar11 = gtl::internal_btree::
                 btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                 ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                        *)local_3a8.iter_.map_);
        local_3a8.iter_.end_.node = cVar11.node;
        local_3a8.iter_.end_.position = cVar11.position;
        if (local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
      }
      else {
        bVar10 = true;
        pRVar9 = local_478.
                 super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          while( true ) {
            pRVar8 = pRVar9 + 1;
            iVar5 = s2pred::CompareDistance
                              (&local_490,
                               &(pRVar9->point_data_->tuple_).
                                super__Tuple_impl<0UL,_Vector3<double>,_int>.
                                super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl,
                               (S1ChordAngle)(this->min_site_separation_ca_).length2_);
            if (iVar5 < 1) break;
            pRVar9 = pRVar8;
            if (pRVar8 == pRVar4) {
              if (bVar10) goto LAB_001a9c72;
              goto LAB_001a9d4d;
            }
          }
          bVar10 = true;
          if (this->snapping_needed_ == false) {
            lVar6 = 0;
            do {
              dVar2 = *(double *)((long)local_490.c_ + lVar6);
              dVar3 = *(double *)
                       ((long)(pRVar9->point_data_->tuple_).
                              super__Tuple_impl<0UL,_Vector3<double>,_int>.
                              super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_ + lVar6)
              ;
              if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) break;
              bVar10 = lVar6 != 0x10;
              lVar6 = lVar6 + 8;
            } while (bVar10);
            bVar10 = (bool)(-(dVar2 != dVar3) & 1);
          }
          this->snapping_needed_ = bVar10;
          bVar10 = false;
          pRVar9 = pRVar8;
        } while (pRVar8 != pRVar4);
      }
LAB_001a9d4d:
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != local_448);
  }
  if (local_440.
      super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_440.
                    super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_478.
      super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_478.
                    super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  S2ClosestPointQueryBase<S2MinDistance,_int>::~S2ClosestPointQueryBase(&local_3a8);
  return;
}

Assistant:

void S2Builder::ChooseInitialSites(S2PointIndex<SiteId>* site_index) {
  // Find all points whose distance is <= min_site_separation_ca_.
  S2ClosestPointQueryOptions options;
  options.set_conservative_max_distance(min_site_separation_ca_);
  S2ClosestPointQuery<SiteId> site_query(site_index, options);
  vector<S2ClosestPointQuery<SiteId>::Result> results;

  // Apply the snap_function() to each input vertex, then check whether any
  // existing site is closer than min_vertex_separation().  If not, then add a
  // new site.
  //
  // NOTE(ericv): There are actually two reasonable algorithms, which we call
  // "snap first" (the one above) and "snap last".  The latter checks for each
  // input vertex whether any existing site is closer than snap_radius(), and
  // only then applies the snap_function() and adds a new site.  "Snap last"
  // can yield slightly fewer sites in some cases, but it is also more
  // expensive and can produce surprising results.  For example, if you snap
  // the polyline "0:0, 0:0.7" using IntLatLngSnapFunction(0), the result is
  // "0:0, 0:0" rather than the expected "0:0, 0:1", because the snap radius
  // is approximately sqrt(2) degrees and therefore it is legal to snap both
  // input points to "0:0".  "Snap first" produces "0:0, 0:1" as expected.
  for (const InputVertexKey& key : SortInputVertices()) {
    const S2Point& vertex = input_vertices_[key.second];
    S2Point site = SnapSite(vertex);
    // If any vertex moves when snapped, the output cannot be idempotent.
    snapping_needed_ = snapping_needed_ || site != vertex;

    // FindClosestPoints() measures distances conservatively, so we need to
    // recheck the distances using exact predicates.
    //
    // NOTE(ericv): When the snap radius is large compared to the average
    // vertex spacing, we could possibly avoid the call the FindClosestPoints
    // by checking whether sites_.back() is close enough.
    S2ClosestPointQueryPointTarget target(site);
    site_query.FindClosestPoints(&target, &results);
    bool add_site = true;
    for (const auto& result : results) {
      if (s2pred::CompareDistance(site, result.point(),
                                  min_site_separation_ca_) <= 0) {
        add_site = false;
        // This pair of sites is too close.  If the sites are distinct, then
        // the output cannot be idempotent.
        snapping_needed_ = snapping_needed_ || site != result.point();
      }
    }
    if (add_site) {
      site_index->Add(site, sites_.size());
      sites_.push_back(site);
      site_query.ReInit();
    }
  }
}